

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O3

Acec_Box_t * Acec_CreateBox(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vTree)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  Vec_Bit_t *vVisit;
  int *__s;
  byte *__s_00;
  Acec_Box_t *pAVar11;
  Vec_Wec_t *vBoxes;
  Vec_Int_t *pVVar12;
  Vec_Wec_t *pVVar13;
  Vec_Wec_t *pVVar14;
  Vec_Int_t *pVVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  size_t sVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  long local_a8;
  void *local_60;
  
  iVar10 = vTree->nSize;
  uVar16 = 0;
  if (1 < (long)iVar10) {
    uVar16 = 0;
    uVar17 = 1;
    do {
      if ((int)uVar16 <= vTree->pArray[uVar17]) {
        uVar16 = vTree->pArray[uVar17];
      }
      uVar17 = uVar17 + 2;
    } while (uVar17 < (ulong)(long)iVar10);
  }
  uVar9 = vAdds->nSize / 6;
  iVar22 = (((int)uVar9 >> 5) + 1) - (uint)((uVar9 & 0x1f) == 0);
  vVisit = (Vec_Bit_t *)malloc(0x10);
  vVisit->nCap = iVar22 * 0x20;
  if (iVar22 == 0) {
    sVar23 = 0;
    __s = (int *)0x0;
  }
  else {
    sVar23 = (long)iVar22 << 2;
    __s = (int *)malloc(sVar23);
  }
  vVisit->pArray = __s;
  vVisit->nSize = iVar22 * 0x20;
  memset(__s,0,sVar23);
  iVar22 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  if (iVar22 == 0) {
    local_60 = (void *)0x0;
    sVar23 = 0;
    __s_00 = (byte *)0x0;
  }
  else {
    sVar23 = (long)iVar22 << 2;
    local_60 = calloc(1,sVar23);
    __s_00 = (byte *)malloc(sVar23);
  }
  uVar8 = iVar22 * 0x20;
  memset(__s_00,0,sVar23);
  lVar26 = 1;
  pAVar11 = (Acec_Box_t *)calloc(1,0x30);
  pAVar11->pGia = p;
  uVar9 = uVar16 + 1;
  vBoxes = (Vec_Wec_t *)malloc(0x10);
  sVar23 = (size_t)uVar9;
  if (uVar16 < 7) {
    sVar23 = 8;
  }
  vBoxes->nCap = (int)sVar23;
  pVVar12 = (Vec_Int_t *)calloc(sVar23,0x10);
  vBoxes->pArray = pVVar12;
  vBoxes->nSize = uVar9;
  pAVar11->vAdds = vBoxes;
  pVVar13 = (Vec_Wec_t *)malloc(0x10);
  pVVar13->nCap = (int)sVar23;
  pVVar12 = (Vec_Int_t *)calloc(sVar23,0x10);
  pVVar13->pArray = pVVar12;
  pVVar13->nSize = uVar9;
  pAVar11->vLeafLits = pVVar13;
  pVVar14 = (Vec_Wec_t *)malloc(0x10);
  sVar23 = 8;
  if (5 < uVar16) {
    sVar23 = (size_t)(uVar16 + 2);
  }
  pVVar14->nCap = (int)sVar23;
  pVVar12 = (Vec_Int_t *)calloc(sVar23,0x10);
  pVVar14->pArray = pVVar12;
  pVVar14->nSize = uVar16 + 2;
  pAVar11->vRootLits = pVVar14;
  if (1 < iVar10) {
    do {
      iVar10 = vTree->pArray[lVar26 + -1];
      if (iVar10 < 0) {
LAB_00682b5c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar9 = iVar10 * 6;
      uVar16 = vAdds->nSize;
      if (uVar16 == uVar9 || SBORROW4(uVar16,uVar9) != (int)(uVar16 + iVar10 * -6) < 0)
      goto LAB_00682b5c;
      piVar4 = vAdds->pArray;
      uVar2 = piVar4[uVar9];
      if (((int)uVar2 < 0) || ((int)uVar8 <= (int)uVar2)) goto LAB_00682b9a;
      uVar3 = vTree->pArray[lVar26];
      puVar1 = (uint *)((long)local_60 + (ulong)(uVar2 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar2 & 0x1f);
      if (uVar16 <= (uVar9 | 1)) goto LAB_00682b5c;
      uVar2 = piVar4[uVar9 | 1];
      if (((int)uVar2 < 0) || (uVar8 <= uVar2)) goto LAB_00682b9a;
      puVar1 = (uint *)((long)local_60 + (ulong)(uVar2 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar2 & 0x1f);
      if (uVar16 <= uVar9 + 2) goto LAB_00682b5c;
      uVar2 = piVar4[uVar9 + 2];
      if (((int)uVar2 < 0) || (uVar8 <= uVar2)) goto LAB_00682b9a;
      puVar1 = (uint *)((long)local_60 + (ulong)(uVar2 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar2 & 0x1f);
      if (uVar16 <= uVar9 + 3) goto LAB_00682b5c;
      uVar2 = piVar4[uVar9 + 3];
      if (((int)uVar2 < 0) || (uVar8 <= uVar2)) goto LAB_00682b9a;
      *(uint *)(__s_00 + (ulong)(uVar2 >> 5) * 4) =
           *(uint *)(__s_00 + (ulong)(uVar2 >> 5) * 4) | 1 << ((byte)uVar2 & 0x1f);
      if (uVar16 <= uVar9 + 4) goto LAB_00682b5c;
      uVar16 = piVar4[uVar9 + 4];
      if (((int)uVar16 < 0) || (uVar8 <= uVar16)) goto LAB_00682b9a;
      *(uint *)(__s_00 + (ulong)(uVar16 >> 5) * 4) =
           *(uint *)(__s_00 + (ulong)(uVar16 >> 5) * 4) | 1 << ((byte)uVar16 & 0x1f);
      iVar20 = vBoxes->nSize;
      if (iVar20 <= (int)uVar3) {
        iVar19 = uVar3 + 1;
        iVar6 = iVar20 * 2;
        if (iVar20 * 2 <= iVar19) {
          iVar6 = iVar19;
        }
        iVar20 = vBoxes->nCap;
        if (iVar20 < iVar6) {
          if (vBoxes->pArray == (Vec_Int_t *)0x0) {
            pVVar12 = (Vec_Int_t *)malloc((long)iVar6 << 4);
          }
          else {
            pVVar12 = (Vec_Int_t *)realloc(vBoxes->pArray,(long)iVar6 << 4);
            iVar20 = vBoxes->nCap;
          }
          vBoxes->pArray = pVVar12;
          memset(pVVar12 + iVar20,0,(long)(iVar6 - iVar20) << 4);
          vBoxes->nCap = iVar6;
        }
        vBoxes->nSize = iVar19;
        iVar20 = iVar19;
      }
      if (((int)uVar3 < 0) || (iVar20 <= (int)uVar3)) goto LAB_00682bb9;
      Vec_IntPush(vBoxes->pArray + uVar3,iVar10);
      lVar26 = lVar26 + 2;
    } while ((int)lVar26 < vTree->nSize);
    uVar9 = vBoxes->nSize;
  }
  if (0 < (int)uVar9) {
    lVar26 = 8;
    lVar24 = 0;
    do {
      qsort(*(void **)((long)&vBoxes->pArray->nCap + lVar26),
            (long)*(int *)((long)vBoxes->pArray + lVar26 + -4),4,Vec_IntSortCompare1);
      lVar24 = lVar24 + 1;
      lVar26 = lVar26 + 0x10;
    } while (lVar24 < vBoxes->nSize);
  }
  pVVar12 = Acec_TreeCarryMap(p,vAdds,vBoxes);
  lVar26 = (long)vBoxes->nSize;
  if (0 < (long)vBoxes->nSize) {
    do {
      if (vBoxes->nSize < lVar26) {
LAB_00682bb9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      lVar24 = lVar26 + -1;
      pVVar15 = vBoxes->pArray;
      iVar10 = pVVar15[lVar24].nSize;
      if (0 < iVar10) {
        lVar21 = 0;
        do {
          iVar20 = pVVar15[lVar24].pArray[lVar21];
          if ((iVar20 < 0) || (uVar16 = iVar20 * 6 + 4, vAdds->nSize <= (int)uVar16))
          goto LAB_00682b5c;
          uVar16 = vAdds->pArray[uVar16];
          if (((int)uVar16 < 0) || ((int)uVar8 <= (int)uVar16)) {
LAB_00682b7b:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                          ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
          }
          if ((*(uint *)((long)local_60 + (ulong)(uVar16 >> 5) * 4) >> (uVar16 & 0x1f) & 1) == 0) {
            Acec_TreePhases_rec(p,vAdds,pVVar12,uVar16,
                                (uint)(vAdds->pArray[(ulong)(uint)(iVar20 * 6) + 2] != 0),vVisit);
            iVar10 = pVVar15[lVar24].nSize;
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < iVar10);
      }
      bVar5 = 1 < lVar26;
      lVar26 = lVar24;
    } while (bVar5);
  }
  Acec_TreeVerifyPhases(p,vAdds,vBoxes);
  Acec_TreeVerifyPhases2(p,vAdds,vBoxes);
  if (__s != (int *)0x0) {
    free(__s);
  }
  free(vVisit);
  if (pVVar12->pArray != (int *)0x0) {
    free(pVVar12->pArray);
  }
  free(pVVar12);
  if (0 < iVar22) {
    *__s_00 = *__s_00 | 1;
    iVar10 = vBoxes->nSize;
    if (0 < iVar10) {
      local_a8 = 0;
      do {
        pVVar12 = vBoxes->pArray;
        if (0 < pVVar12[local_a8].nSize) {
          uVar16 = (int)local_a8 + 1;
          lVar26 = 0;
          do {
            iVar10 = pVVar12[local_a8].pArray[lVar26];
            iVar22 = iVar10 * 6;
            uVar9 = iVar10 * 6 + 5;
            uVar17 = (ulong)uVar9;
            lVar24 = (long)iVar22;
            lVar21 = 0;
            do {
              if ((iVar10 < 0) || ((long)vAdds->nSize <= lVar24 + lVar21)) goto LAB_00682b5c;
              uVar2 = vAdds->pArray[lVar24 + lVar21];
              if (((int)uVar2 < 0) || ((int)uVar8 <= (int)uVar2)) goto LAB_00682b7b;
              if ((*(uint *)(__s_00 + (ulong)(uVar2 >> 5) * 4) >> (uVar2 & 0x1f) & 1) == 0) {
                if (vAdds->nSize <= (int)uVar9) goto LAB_00682b5c;
                uVar3 = vAdds->pArray[uVar17];
                if (pVVar13->nSize <= local_a8) {
                  uVar25 = pVVar13->nSize * 2;
                  if ((int)uVar25 <= (int)uVar16) {
                    uVar25 = uVar16;
                  }
                  iVar20 = pVVar13->nCap;
                  if (iVar20 < (int)uVar25) {
                    if (pVVar13->pArray == (Vec_Int_t *)0x0) {
                      pVVar15 = (Vec_Int_t *)malloc((ulong)uVar25 << 4);
                    }
                    else {
                      pVVar15 = (Vec_Int_t *)realloc(pVVar13->pArray,(ulong)uVar25 << 4);
                      iVar20 = pVVar13->nCap;
                    }
                    pVVar13->pArray = pVVar15;
                    memset(pVVar15 + iVar20,0,(long)(int)(uVar25 - iVar20) << 4);
                    pVVar13->nCap = uVar25;
                  }
                  pVVar13->nSize = uVar16;
                }
                Vec_IntPush(pVVar13->pArray + local_a8,
                            (uint)((uVar3 >> ((byte)((byte)lVar21 | 0x10) & 0x1f) & 1) != 0) +
                            uVar2 * 2);
              }
              lVar21 = lVar21 + 1;
            } while (lVar21 != 3);
            lVar21 = 3;
            do {
              if ((iVar22 + 3 < 0) || ((long)vAdds->nSize <= lVar24 + lVar21)) goto LAB_00682b5c;
              uVar2 = vAdds->pArray[lVar24 + lVar21];
              if (((int)uVar2 < 0) || ((int)uVar8 <= (int)uVar2)) goto LAB_00682b7b;
              if ((*(uint *)((long)local_60 + (ulong)(uVar2 >> 5) * 4) >> (uVar2 & 0x1f) & 1) == 0)
              {
                if (vAdds->nSize <= (int)uVar9) goto LAB_00682b5c;
                uVar25 = (uint)(lVar21 == 4) + (int)local_a8;
                uVar3 = vAdds->pArray[uVar17];
                if (pVVar14->nSize <= (int)uVar25) {
                  uVar18 = uVar25 + 1;
                  uVar7 = pVVar14->nSize * 2;
                  if ((int)uVar7 <= (int)uVar18) {
                    uVar7 = uVar18;
                  }
                  iVar10 = pVVar14->nCap;
                  if (iVar10 < (int)uVar7) {
                    if (pVVar14->pArray == (Vec_Int_t *)0x0) {
                      pVVar15 = (Vec_Int_t *)malloc((ulong)uVar7 << 4);
                    }
                    else {
                      pVVar15 = (Vec_Int_t *)realloc(pVVar14->pArray,(ulong)uVar7 << 4);
                      iVar10 = pVVar14->nCap;
                    }
                    pVVar14->pArray = pVVar15;
                    memset(pVVar15 + iVar10,0,(long)(int)(uVar7 - iVar10) << 4);
                    pVVar14->nCap = uVar7;
                  }
                  pVVar14->nSize = uVar18;
                }
                Vec_IntPush(pVVar14->pArray + uVar25,
                            (uint)((uVar3 >> ((byte)((byte)lVar21 | 0x10) & 0x1f) & 1) != 0) +
                            uVar2 * 2);
              }
              lVar21 = lVar21 + 1;
            } while (lVar21 != 5);
            if (vAdds->nSize <= (int)(iVar22 + 2U)) goto LAB_00682b5c;
            if (vAdds->pArray[iVar22 + 2U] == 0) {
              if ((uint)vAdds->nSize <= uVar9) goto LAB_00682b5c;
              if ((*(byte *)((long)vAdds->pArray + uVar17 * 4 + 2) & 4) != 0) {
                if (pVVar13->nSize <= local_a8) {
                  uVar9 = pVVar13->nSize * 2;
                  if ((int)uVar9 <= (int)uVar16) {
                    uVar9 = uVar16;
                  }
                  iVar10 = pVVar13->nCap;
                  if (iVar10 < (int)uVar9) {
                    if (pVVar13->pArray == (Vec_Int_t *)0x0) {
                      pVVar15 = (Vec_Int_t *)malloc((ulong)uVar9 << 4);
                    }
                    else {
                      pVVar15 = (Vec_Int_t *)realloc(pVVar13->pArray,(ulong)uVar9 << 4);
                      iVar10 = pVVar13->nCap;
                    }
                    pVVar13->pArray = pVVar15;
                    memset(pVVar15 + iVar10,0,(long)(int)(uVar9 - iVar10) << 4);
                    pVVar13->nCap = uVar9;
                  }
                  pVVar13->nSize = uVar16;
                }
                Vec_IntPush(pVVar13->pArray + local_a8,1);
              }
            }
            lVar26 = lVar26 + 1;
          } while (lVar26 < pVVar12[local_a8].nSize);
          iVar10 = vBoxes->nSize;
        }
        local_a8 = local_a8 + 1;
      } while (local_a8 < iVar10);
    }
    if (local_60 != (void *)0x0) {
      free(local_60);
    }
    free(__s_00);
    if (0 < pVVar13->nSize) {
      lVar26 = 8;
      lVar24 = 0;
      do {
        qsort(*(void **)((long)&pVVar13->pArray->nCap + lVar26),
              (long)*(int *)((long)pVVar13->pArray + lVar26 + -4),4,Vec_IntSortCompare1);
        lVar24 = lVar24 + 1;
        lVar26 = lVar26 + 0x10;
      } while (lVar24 < pVVar13->nSize);
    }
    if (0 < pVVar14->nSize) {
      lVar26 = 8;
      lVar24 = 0;
      do {
        qsort(*(void **)((long)&pVVar14->pArray->nCap + lVar26),
              (long)*(int *)((long)pVVar14->pArray + lVar26 + -4),4,Vec_IntSortCompare2);
        lVar24 = lVar24 + 1;
        lVar26 = lVar26 + 0x10;
      } while (lVar24 < pVVar14->nSize);
    }
    return pAVar11;
  }
LAB_00682b9a:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
}

Assistant:

Acec_Box_t * Acec_CreateBox( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vTree )
{
    int MaxRank = Acec_CreateBoxMaxRank(vTree);
    Vec_Bit_t * vVisit  = Vec_BitStart( Vec_IntSize(vAdds)/6 );
    Vec_Bit_t * vIsLeaf = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Bit_t * vIsRoot = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel, * vMap;
    int i, j, k, Box, Rank;//, Count = 0;

    Acec_Box_t * pBox = ABC_CALLOC( Acec_Box_t, 1 );
    pBox->pGia        = p;
    pBox->vAdds       = Vec_WecStart( MaxRank + 1 );
    pBox->vLeafLits   = Vec_WecStart( MaxRank + 1 );
    pBox->vRootLits   = Vec_WecStart( MaxRank + 2 );

    // collect boxes; mark inputs/outputs
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
//        if ( 37 == Box && 6 == Rank )
//        {
//            printf( "Skipping one adder...\n" );
//            continue;
//        }
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+0), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+1), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+2), 1 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+3), 1 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+4), 1 );
        Vec_WecPush( pBox->vAdds, Rank, Box );
    }
    // sort each level
    Vec_WecForEachLevel( pBox->vAdds, vLevel, i )
        Vec_IntSort( vLevel, 0 );

    // set phases starting from roots
    vMap = Acec_TreeCarryMap( p, vAdds, pBox->vAdds );
    Vec_WecForEachLevelReverse( pBox->vAdds, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, k )
            if ( !Vec_BitEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+4) ) )
            {
                //printf( "Pushing phase of output %d of box %d\n", Vec_IntEntry(vAdds, 6*Box+4), Box );
                Acec_TreePhases_rec( p, vAdds, vMap, Vec_IntEntry(vAdds, 6*Box+4), Vec_IntEntry(vAdds, 6*Box+2) != 0, vVisit );
            }
    Acec_TreeVerifyPhases( p, vAdds, pBox->vAdds );
    Acec_TreeVerifyPhases2( p, vAdds, pBox->vAdds );
    Vec_BitFree( vVisit );
    Vec_IntFree( vMap );

    // collect inputs/outputs
    Vec_BitWriteEntry( vIsRoot, 0, 1 );
    Vec_WecForEachLevel( pBox->vAdds, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, j )
        {
            for ( k = 0; k < 3; k++ )
                if ( !Vec_BitEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+k) ) )
                    Vec_WecPush( pBox->vLeafLits, i, Abc_Var2Lit(Vec_IntEntry(vAdds, 6*Box+k), Acec_SignBit2(vAdds, Box, k)) );
            for ( k = 3; k < 5; k++ )
                if ( !Vec_BitEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+k) ) )
                {
                    //if ( Vec_IntEntry(vAdds, 6*Box+k) == 10942 )
                    //{
                    //    printf( "++++++++++++ Skipping special\n" );
                    //    continue;
                    //}
                    Vec_WecPush( pBox->vRootLits, k == 4 ? i + 1 : i, Abc_Var2Lit(Vec_IntEntry(vAdds, 6*Box+k), Acec_SignBit2(vAdds, Box, k)) );
                }
            if ( Vec_IntEntry(vAdds, 6*Box+2) == 0 && Acec_SignBit2(vAdds, Box, 2) )
                Vec_WecPush( pBox->vLeafLits, i, 1 );
        }
    Vec_BitFree( vIsLeaf );
    Vec_BitFree( vIsRoot );
    // sort each level
    Vec_WecForEachLevel( pBox->vLeafLits, vLevel, i )
        Vec_IntSort( vLevel, 0 );
    Vec_WecForEachLevel( pBox->vRootLits, vLevel, i )
        Vec_IntSort( vLevel, 1 );
    //return pBox;
/*
    // push literals forward
    //Vec_WecPrint( pBox->vLeafLits, 0 );
    Vec_WecForEachLevel( pBox->vLeafLits, vLevel, i )
    {
        int This, Prev = Vec_IntEntry(vLevel, 0);
        Vec_IntForEachEntryStart( vLevel, This, j, 1 )
        {
            if ( Prev != This )
            {
                Prev = This;
                continue;
            }
            if ( i+1 >= Vec_WecSize(pBox->vLeafLits) )
                continue;
            Vec_IntPushOrder( Vec_WecEntry(pBox->vLeafLits, i+1), This );
            Vec_IntDrop( vLevel, j-- );
            Vec_IntDrop( vLevel, j-- );
            Prev = -1;
            Count++;
        }
    }
    printf( "Pushed forward %d input literals.\n", Count );
*/
    //Vec_WecPrint( pBox->vLeafLits, 0 );
    return pBox;
}